

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileContinue(jx9_gen_state *pGen)

{
  sxu32 nLine_00;
  sxi64 sVar1;
  GenBlock *pGVar2;
  undefined4 local_38;
  sxi32 local_34;
  JumpFixup sJumpFix;
  sxu32 nInstrIdx;
  sxi32 rc;
  sxu32 nLine;
  sxi32 iLevel;
  GenBlock *pLoop;
  jx9_gen_state *pGen_local;
  
  nLine_00 = pGen->pIn->nLine;
  rc = 0;
  pGen->pIn = pGen->pIn + 1;
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 3) != 0)) {
    sVar1 = jx9TokenValueToInt64(&pGen->pIn->sData);
    rc = (sxi32)sVar1;
    if (rc < 2) {
      rc = 0;
    }
    pGen->pIn = pGen->pIn + 1;
  }
  pGVar2 = GenStateFetchBlock(pGen->pCurrent,1,rc);
  if (pGVar2 == (GenBlock *)0x0) {
    sJumpFix.nInstrIdx =
         jx9GenCompileError(pGen,1,nLine_00,
                            "A \'continue\' statement may only be used within a loop or switch");
    if (sJumpFix.nInstrIdx == 0xfffffff6) {
      return -10;
    }
  }
  else {
    sJumpFix.nJumpType = 0;
    jx9VmEmitInstr(pGen->pVm,8,0,pGVar2->nFirstInstr,(void *)0x0,(sxu32 *)&sJumpFix);
    if (pGVar2->bPostContinue == '\x01') {
      local_38 = 8;
      local_34 = sJumpFix.nJumpType;
      SySetPut(&pGVar2->aPostContFix,&local_38);
    }
  }
  if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x40000) == 0)) {
    jx9GenCompileError(pGen,2,pGen->pIn->nLine,
                       "Expected semi-colon \';\' after \'continue\' statement");
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileContinue(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'continue' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Point to the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal continue */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "A 'continue' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx = 0;
		/* Emit the unconditional jump to the beginning of the target loop */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pLoop->nFirstInstr, 0, &nInstrIdx);
		if( pLoop->bPostContinue == TRUE ){
			JumpFixup sJumpFix;
			/* Post-continue */
			sJumpFix.nJumpType = JX9_OP_JMP;
			sJumpFix.nInstrIdx = nInstrIdx;
			SySetPut(&pLoop->aPostContFix, (const void *)&sJumpFix);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'continue' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}